

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O1

FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> * __thiscall
FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor>::file_info
          (FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this,CommandOptions *Options
          ,char *type_string,FILE *stream)

{
  PathList_t *pPVar1;
  uint uVar2;
  char *pcVar3;
  FILE *in_R8;
  char *pcVar4;
  allocator<char> local_131;
  AtmosDescriptor *local_130;
  FILE *local_128;
  long *local_120 [2];
  long local_110 [2];
  AtmosDescriptor local_100;
  
  if (stream != (FILE *)0x0) {
    if (in_R8 == (_IO_FILE *)0x0) {
      in_R8 = _stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,*(char **)(*(long *)(type_string + 8) + 0x10),&local_131);
    pPVar1 = &Options->filenames;
    ASDCP::ATMOS::MXFReader::OpenRead((string *)&local_100);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_100);
    Kumu::Result_t::~Result_t((Result_t *)&local_100);
    if (local_120[0] != local_110) {
      operator_delete(local_120[0],local_110[0] + 1);
    }
    if (*(int *)&this->_vptr_FileInfoWrapper < 0) {
      if ((*(int *)&this->_vptr_FileInfoWrapper == ASDCP::RESULT_FORMAT) &&
         (type_string[0x21] == '\x01')) {
        ASDCP::ATMOS::MXFReader::DumpHeaderMetadata((_IO_FILE *)pPVar1);
      }
    }
    else {
      local_130 = (AtmosDescriptor *)
                  &(Options->filenames).
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size;
      local_128 = stream;
      ASDCP::ATMOS::MXFReader::FillAtmosDescriptor(&local_100);
      Kumu::Result_t::~Result_t((Result_t *)&local_100);
      ASDCP::ATMOS::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      uVar2._0_1_ = Options->showindex_flag;
      uVar2._1_1_ = Options->showheader_flag;
      uVar2._2_1_ = Options->stereo_image_flag;
      uVar2._3_1_ = Options->showid_flag;
      pcVar3 = "Interop";
      if ((int)Options[5].filenames.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size == 2) {
        pcVar3 = "SMPTE 429";
      }
      pcVar4 = "s";
      if (uVar2 == 1) {
        pcVar4 = "";
      }
      fprintf(_stdout,"%s file essence type is %s, (%d edit unit%s).\n",pcVar3,local_128,
              (ulong)uVar2,pcVar4);
      if (type_string[0x21] == '\x01') {
        ASDCP::ATMOS::MXFReader::DumpHeaderMetadata((_IO_FILE *)pPVar1);
      }
      if (type_string[0x23] == '\x01') {
        ASDCP::WriterInfoDump((WriterInfo *)(Options + 2),in_R8);
      }
      if (type_string[0x24] == '\x01') {
        ASDCP::ATMOS::AtmosDescriptorDump(local_130,in_R8);
      }
      if (type_string[0x20] == '\x01') {
        ASDCP::ATMOS::MXFReader::DumpIndex((_IO_FILE *)pPVar1);
      }
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-info.cpp"
                ,0x13e,
                "Result_t FileInfoWrapper<ASDCP::ATMOS::MXFReader, MyAtmosDescriptor>::file_info(CommandOptions &, const char *, FILE *) [ReaderT = ASDCP::ATMOS::MXFReader, DescriptorT = MyAtmosDescriptor]"
               );
}

Assistant:

Result_t
  file_info(CommandOptions& Options, const char* type_string, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;
    result = m_Reader.OpenRead(Options.filenames.front().c_str());

    if ( ASDCP_SUCCESS(result) )
      {
	m_Desc.FillDescriptor(m_Reader);
	m_Reader.FillWriterInfo(m_WriterInfo);

	fprintf(stdout, "%s file essence type is %s, (%d edit unit%s).\n",
		( m_WriterInfo.LabelSetType == LS_MXF_SMPTE ? "SMPTE 429" : LS_MXF_INTEROP ? "Interop" : "Unknown" ),
		type_string, m_Desc.ContainerDuration, (m_Desc.ContainerDuration==1?"":"s"));

	if ( Options.showheader_flag )
	  m_Reader.DumpHeaderMetadata(stream);

	if ( Options.showid_flag )
	  WriterInfoDump(m_WriterInfo, stream);

	if ( Options.showdescriptor_flag )
	  m_Desc.Dump(stream);

	if ( Options.showindex_flag )
	  m_Reader.DumpIndex(stream);
      }
    else if ( result == RESULT_FORMAT && Options.showheader_flag )
      {
	m_Reader.DumpHeaderMetadata(stream);
      }

    return result;
  }